

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  bool bVar1;
  Orphanage OVar2;
  Builder root;
  OrphanBuilder local_148;
  PointerBuilder local_128;
  ArrayPtr<const_unsigned_char> local_110;
  WirePointer *local_100;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar2 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&root,(EVP_PKEY_CTX *)OVar2.arena);
  local_148.segment = (SegmentBuilder *)root._builder.capTable;
  local_148.capTable = (CapTableBuilder *)root._builder.data;
  local_148.location = (word *)root._builder.pointers;
  local_148.tag.content = (uint64_t)root._builder.segment;
  root._builder._16_16_ = OrphanBuilder::asDataReader(&local_148);
  if (root._builder.pointers == 3) {
    bVar1 = (char)root._builder.data[1] == 'o' && *root._builder.data == 0x6f66;
  }
  else {
    bVar1 = false;
  }
  root._builder.segment = (SegmentBuilder *)anon_var_dwarf_a72e;
  root._builder.capTable = (CapTableBuilder *)0x3;
  root._builder._32_8_ = anon_var_dwarf_a914;
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_128.segment = (SegmentBuilder *)0x28e14b;
    local_128.capTable = (CapTableBuilder *)0x3;
    local_110 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&local_148);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x119,ERROR,
               "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", _kjCondition, data(\"foo\"), orphan.getReader()"
               ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&root,
               (Reader *)&local_128,(Reader *)&local_110);
  }
  MessageBuilder::getRootInternal((Builder *)&local_110,&builder.super_MessageBuilder);
  local_128.pointer = local_100;
  local_128.segment = (SegmentBuilder *)local_110.ptr;
  local_128.capTable = (CapTableBuilder *)local_110.size_;
  PointerBuilder::initStruct(&root._builder,&local_128,(StructSize)0x140006);
  local_128.pointer = root._builder.pointers + 1;
  local_128.segment = root._builder.segment;
  local_128.capTable = root._builder.capTable;
  PointerBuilder::adopt(&local_128,&local_148);
  if (local_148.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_148);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}